

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

ObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::GetObservationHistoryTree
          (PlanningUnitMADPDiscrete *this,Index agentI,Index ohI)

{
  pointer pvVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  size_t sVar4;
  const_reference this_00;
  const_reference ppOVar5;
  ostream *poVar6;
  E *this_01;
  char *pcVar7;
  pointer_____offset_0x10___ *ppuVar8;
  ulong __n;
  
  if ((this->_m_params)._m_individualObservationHistories == false) {
    this_01 = (E *)__cxa_allocate_exception(0x28);
    ENotCached::ENotCached
              ((ENotCached *)this_01,
               "PlanningUnitMADPDiscrete::GetObservationHistoryTree IndividualObservationHistories are not cached!"
              );
    ppuVar8 = &ENotCached::typeinfo;
  }
  else {
    iVar2 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])();
    lVar3 = (long)(this->_m_observationHistoryTreeVectors).
                  super__Vector_base<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_m_observationHistoryTreeVectors).
                  super__Vector_base<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (lVar3 / 0x18 == CONCAT44(extraout_var,iVar2)) {
      __n = (ulong)agentI;
      if (CONCAT44(extraout_var,iVar2) <= __n) {
        pcVar7 = 
        "WARNING PlanningUnitMADPDiscrete::GetObservationHistory(Index agentI, Index ohI) index agentI out of bounds"
        ;
LAB_004641fb:
        poVar6 = std::operator<<((ostream *)&std::cerr,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar6);
        return (ObservationHistoryTree *)0x0;
      }
      sVar4 = GetNrObservationHistories(this,agentI);
      pvVar1 = (this->_m_observationHistoryTreeVectors).
               super__Vector_base<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pvVar1[__n].
                super__Vector_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          *(long *)&pvVar1[__n].
                    super__Vector_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>
                    ._M_impl.super__Vector_impl_data >> 3 == sVar4) {
        if (ohI < sVar4) {
          this_00 = std::
                    vector<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
                    ::at(&this->_m_observationHistoryTreeVectors,__n);
          ppOVar5 = std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>
                    ::at(this_00,(ulong)ohI);
          return *ppOVar5;
        }
        pcVar7 = 
        "WARNING PlanningUnitMADPDiscrete::GetObservationHistory(Index agentI, Index a) index ohI out of bounds"
        ;
        goto LAB_004641fb;
      }
      this_01 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_01,"_m_observationHistoryTreeVectors[agentI].size() != nrOH)");
    }
    else {
      this_01 = (E *)__cxa_allocate_exception(0x28,0x18,lVar3 % 0x18);
      E::E(this_01,"_m_observationHistoryTreeVectors.size() != nrA)");
    }
    ppuVar8 = &E::typeinfo;
  }
  __cxa_throw(this_01,ppuVar8,E::~E);
}

Assistant:

ObservationHistoryTree* PlanningUnitMADPDiscrete::GetObservationHistoryTree(Index agentI, Index ohI) const
{
    if(!_m_params.GetComputeIndividualObservationHistories())
        throw ENotCached("PlanningUnitMADPDiscrete::GetObservationHistoryTree IndividualObservationHistories are not cached!");

    size_t nrA = GetNrAgents();
    if(_m_observationHistoryTreeVectors.size() != nrA)
        throw E("_m_observationHistoryTreeVectors.size() != nrA)");

    if(agentI < nrA )
    {
    size_t nrOH = GetNrObservationHistories(agentI);
if(DEBUG_PUD){cout << "_m_observationHistoryTreeVectors["<<agentI<<"].size() = " <<_m_observationHistoryTreeVectors[agentI].size()<<endl;}
    if(_m_observationHistoryTreeVectors[agentI].size() != nrOH)
        throw E("_m_observationHistoryTreeVectors[agentI].size() != nrOH)");

    if(ohI < nrOH )
    {
if(DEBUG_PUD){ cout <<"accessing _m_observationHistoryTreeVectors["<<    agentI<<"]["<<ohI<<"]"<<endl;}

        ObservationHistoryTree* oht = 
            _m_observationHistoryTreeVectors.at(agentI).at(ohI);
if(DEBUG_PUD){ cout <<"...done - returning "<<oht<<endl;}
        return (oht);
    }
    else
        cerr << "WARNING PlanningUnitMADPDiscrete::GetObservationHistory(Index agentI, Index a) index ohI out of bounds"<<endl;
    }
    else
    cerr << "WARNING PlanningUnitMADPDiscrete::GetObservationHistory(Index agentI, Index ohI) index agentI out of bounds"<<endl;   
    
    return(0);
   
}